

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code.hpp
# Opt level: O3

int __thiscall
system_error2::status_code<system_error2::detail::erased<long,_true>_>::clone
          (status_code<system_error2::detail::erased<long,_true>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  status_code_domain *psVar1;
  char cVar2;
  int iVar3;
  status_code<system_error2::detail::erased<long,_true>_> x;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_50 [48];
  
  psVar1 = (this->
           super_mixin<system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>,_system_error2::detail::erased<long,_true>_>
           ).super_status_code_storage<system_error2::detail::erased<long,_true>_>.
           super_status_code<void>._domain;
  if (psVar1 == (status_code_domain *)0x0) {
    iVar3 = 0;
  }
  else {
    local_68 = 0;
    uStack_60 = 0;
    (**(code **)(*(long *)psVar1 + 8))(local_50,psVar1,__child_stack,___flags);
    cVar2 = (**(code **)(*(long *)psVar1 + 0x38))(psVar1,&local_68,this);
    if (cVar2 == '\0') {
      abort();
    }
    iVar3 = (int)local_68;
  }
  return iVar3;
}

Assistant:

SYSTEM_ERROR2_CONSTEXPR20 status_code clone() const
  {
    if(nullptr == this->_domain)
    {
      return {};
    }
    status_code x;
    if(!this->_domain->_do_erased_copy(x, *this, this->_domain->payload_info()))
    {
      abort();  // should not be possible
    }
    return x;
  }